

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transwarp.h
# Opt level: O2

void __thiscall
transwarp::detail::task_impl_base<$1a67ba37$>::schedule_impl
          (task_impl_base<_1a67ba37_> *this,bool reset,executor *executor)

{
  element_type *peVar1;
  runner<_9c922731_> *this_00;
  shared_ptr<_5bfabb08_> runner;
  weak_ptr<_4fdb7c5e_> self;
  __shared_ptr<_9c7aa866_> local_78;
  __shared_ptr<_9c7aa866_> local_68;
  undefined1 local_58 [32];
  weak_ptr<_4fdb7c5e_> local_38;
  
  if (this->schedule_mode_ != true) {
    return;
  }
  if (reset) {
    LOCK();
    (((this->node_).super___shared_ptr<transwarp::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    canceled_)._M_base._M_i = false;
    UNLOCK();
  }
  else if ((this->future_).super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           != (element_type *)0x0) {
    return;
  }
  std::
  __shared_ptr<transwarp::detail::task_impl_base<void,transwarp::consume_type,void(*)(std::tuple<std::__cxx11::string,int,int>const&,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>const&,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const&,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&),std::tuple<std::__cxx11::string,int,int>,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::__cxx11::string,std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<transwarp::detail::task_impl_base<void,transwarp::consume_type,void(*)(std::tuple<std::__cxx11::string,int,int>const&,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>const&,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const&,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&),std::tuple<std::__cxx11::string,int,int>,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::__cxx11::string,std::__cxx11::string>,void>
            ((__shared_ptr<transwarp::detail::task_impl_base<void,transwarp::consume_type,void(*)(std::tuple<std::__cxx11::string,int,int>const&,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>const&,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const&,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&),std::tuple<std::__cxx11::string,int,int>,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::__cxx11::string,std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
              *)local_58,(__weak_ptr<_b961c150_> *)&this->super_enable_shared_from_this<_4fdb7c5e_>)
  ;
  std::
  __weak_ptr<transwarp::detail::task_impl_base<void,transwarp::consume_type,void(*)(std::tuple<std::__cxx11::string,int,int>const&,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>const&,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const&,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&),std::tuple<std::__cxx11::string,int,int>,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::__cxx11::string,std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
  ::
  __weak_ptr<transwarp::detail::task_impl_base<void,transwarp::consume_type,void(*)(std::tuple<std::__cxx11::string,int,int>const&,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>const&,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const&,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&),std::tuple<std::__cxx11::string,int,int>,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::__cxx11::string,std::__cxx11::string>,void>
            ((__weak_ptr<transwarp::detail::task_impl_base<void,transwarp::consume_type,void(*)(std::tuple<std::__cxx11::string,int,int>const&,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>const&,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const&,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&),std::tuple<std::__cxx11::string,int,int>,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::__cxx11::string,std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
              *)&local_38,(__shared_ptr<_b961c150_> *)local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  this_00 = (runner<_9c922731_> *)operator_new(0xb0);
  runner<$9c922731$>::runner
            (this_00,((this->node_).super___shared_ptr<transwarp::node,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->id_,&local_38,&this->parents_);
  std::
  __shared_ptr<transwarp::detail::runner<void,transwarp::consume_type,transwarp::detail::task_impl_base<void,transwarp::consume_type,void(*)(std::tuple<std::__cxx11::string,int,int>const&,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>const&,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const&,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&),std::tuple<std::__cxx11::string,int,int>,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>,int,bool,std::map<std::__cxx11::string,std::vector...cxx11::string>>,std::shared_ptr<transwarp::task<std::__cxx11::string>>>>,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<transwarp::detail::runner<void,transwarp::consume_type,transwarp::detail::task_impl_base<void,transwarp::consume_type,void(*)(std::tuple<std::__cxx11::string,int,int>const&,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>const&,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const&,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&),std::tuple<std::__cxx11::string,int,int>,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>,int,bool,std::map<std::__cxx11::string,std::vector___ranswarp::task<std::__cxx11::string>>,std::shared_ptr<transwarp::task<std::__cxx11::string>>>>,void>
            ((__shared_ptr<transwarp::detail::runner<void,transwarp::consume_type,transwarp::detail::task_impl_base<void,transwarp::consume_type,void(*)(std::tuple<std::__cxx11::string,int,int>const&,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>const&,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const&,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&),std::tuple<std::__cxx11::string,int,int>,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>,int,bool,std::map<std::__cxx11::string,std::vector___cxx11::string>>,std::shared_ptr<transwarp::task<std::__cxx11::string>>>>____gnu_cxx___Lock_policy_2>
              *)&local_68,this_00);
  raise_event(this,before_scheduled);
  std::__basic_future<void>::__basic_future
            ((__basic_future<void> *)&local_78,(__state_type *)local_68._M_ptr);
  local_58._0_8_ = local_78._M_ptr;
  local_58._8_8_ = local_78._M_refcount._M_pi;
  local_78._M_ptr = (element_type *)0x0;
  local_78._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::shared_future<void>::operator=(&this->future_,(shared_future<void> *)local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  peVar1 = (this->executor_).super___shared_ptr<transwarp::executor,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    if (executor == (executor *)0x0) {
      runner<$9c922731$>::operator()(local_68._M_ptr);
      goto LAB_001aa0cf;
    }
    std::__shared_ptr<$9c7aa866$>::__shared_ptr(&local_78,&local_68);
    std::function<void()>::
    function<transwarp::detail::task_impl_base<void,transwarp::consume_type,void(*)(std::tuple<std::__cxx11::string,int,int>const&,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>const&,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const&,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&),std::tuple<std::__cxx11::string,int,int>,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::__cxx11::string,std::__cxx11::string>::schedule_impl(bool,transwarp::executor*)::_lambda()_2_,void>
              ((function<void()> *)local_58,(anon_class_16_1_6a50d06e *)&local_78);
    (*executor->_vptr_executor[3])(executor,local_58,&this->node_);
  }
  else {
    std::__shared_ptr<$9c7aa866$>::__shared_ptr(&local_78,&local_68);
    std::function<void()>::
    function<transwarp::detail::task_impl_base<void,transwarp::consume_type,void(*)(std::tuple<std::__cxx11::string,int,int>const&,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>const&,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const&,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&),std::tuple<std::__cxx11::string,int,int>,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::__cxx11::string,std::__cxx11::string>::schedule_impl(bool,transwarp::executor*)::_lambda()_1_,void>
              ((function<void()> *)local_58,(anon_class_16_1_6a50d06e *)&local_78);
    (*peVar1->_vptr_executor[3])(peVar1,local_58,&this->node_);
  }
  std::_Function_base::~_Function_base((_Function_base *)local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
LAB_001aa0cf:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&local_38.super___weak_ptr<_b961c150_>._M_refcount);
  return;
}

Assistant:

void schedule_impl(bool reset, transwarp::executor* executor=nullptr) override {
        if (schedule_mode_ && (reset || !future_.valid())) {
            if (reset) {
                transwarp::detail::node_manip::set_canceled(*node_, false);
            }
            std::weak_ptr<task_impl_base> self = this->shared_from_this();
            using runner_t = transwarp::detail::runner<result_type, task_type, task_impl_base, decltype(parents_)>;
            std::shared_ptr<runner_t> runner = std::shared_ptr<runner_t>(new runner_t(node_->get_id(), self, parents_));
            raise_event(transwarp::event_type::before_scheduled);
            future_ = runner->get_future();
            if (executor_) {
                executor_->execute([runner]{ (*runner)(); }, node_);
            } else if (executor) {
                executor->execute([runner]{ (*runner)(); }, node_);
            } else {
                (*runner)();
            }
        }
    }